

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

int Abc_NtkFlattenHierarchyGia_rec
              (Gia_Man_t *pNew,Vec_Ptr_t *vSupers,Abc_Obj_t *pObj,Vec_Ptr_t *vBuffers)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pObj_00;
  int local_78;
  int local_6c;
  int local_50;
  int i;
  int iLit;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vBuffers_local;
  Abc_Obj_t *pObj_local;
  Vec_Ptr_t *vSupers_local;
  Gia_Man_t *pNew_local;
  
  if ((pObj->field_6).iTemp == -1) {
    iVar1 = Abc_ObjIsNet(pObj);
    if (((iVar1 == 0) && (iVar1 = Abc_ObjIsPo(pObj), iVar1 == 0)) &&
       (iVar1 = Abc_ObjIsBi(pObj), iVar1 == 0)) {
      iVar1 = Abc_ObjIsPi(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsBo(pObj);
        if (iVar1 == 0) {
          iVar1 = Abc_ObjIsNode(pObj);
          if (iVar1 == 0) {
            __assert_fail("Abc_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                          ,0x19d,
                          "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          for (local_50 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_50 < iVar1;
              local_50 = local_50 + 1) {
            pAVar3 = Abc_ObjFanin(pObj,local_50);
            Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pAVar3,vBuffers);
          }
          pNew_local._4_4_ = Abc_NodeStrashToGia(pNew,pObj);
          (pObj->field_6).iTemp = pNew_local._4_4_;
        }
        else {
          pAVar3 = Abc_ObjFanin0(pObj);
          iVar1 = Abc_ObjIsBox(pAVar3);
          if (iVar1 == 0) {
            __assert_fail("Abc_ObjIsBox(pBox)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                          ,400,
                          "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrPush(vSupers,pAVar3);
          pAVar4 = Abc_ObjModel(pAVar3);
          iVar1 = Abc_ObjFanoutNum(pAVar3);
          iVar2 = Abc_NtkPoNum(pAVar4);
          if (iVar1 != iVar2) {
            __assert_fail("Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                          ,0x194,
                          "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          if (((pObj->field_5).iData < 0) ||
             (iVar1 = (pObj->field_5).iData, iVar2 = Abc_NtkPoNum(pAVar4), iVar2 <= iVar1)) {
            __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                          ,0x195,
                          "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          pAVar3 = Abc_NtkPo(pAVar4,(pObj->field_5).iData);
          local_78 = Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pAVar3,vBuffers);
          Vec_PtrPop(vSupers);
          if (vBuffers != (Vec_Ptr_t *)0x0) {
            Vec_PtrPush(vBuffers,pAVar3);
            local_78 = Gia_ManAppendBuf(pNew,local_78);
          }
          (pObj->field_6).iTemp = local_78;
          pNew_local._4_4_ = local_78;
        }
      }
      else {
        pAVar3 = (Abc_Obj_t *)Vec_PtrPop(vSupers);
        pAVar4 = Abc_ObjModel(pAVar3);
        iVar1 = Abc_ObjFaninNum(pAVar3);
        iVar2 = Abc_NtkPiNum(pAVar4);
        if (iVar1 != iVar2) {
          __assert_fail("Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                        ,0x184,
                        "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                       );
        }
        if (((pObj->field_5).iData < 0) ||
           (iVar1 = (pObj->field_5).iData, iVar2 = Abc_NtkPiNum(pAVar4), iVar2 <= iVar1)) {
          __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                        ,0x185,
                        "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                       );
        }
        pObj_00 = Abc_ObjFanin(pAVar3,(pObj->field_5).iData);
        local_6c = Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pObj_00,vBuffers);
        Vec_PtrPush(vSupers,pAVar3);
        if (vBuffers != (Vec_Ptr_t *)0x0) {
          Vec_PtrPush(vBuffers,pObj);
          local_6c = Gia_ManAppendBuf(pNew,local_6c);
        }
        (pObj->field_6).iTemp = local_6c;
        pNew_local._4_4_ = local_6c;
      }
    }
    else {
      pAVar3 = Abc_ObjFanin0(pObj);
      pNew_local._4_4_ = Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pAVar3,vBuffers);
      (pObj->field_6).iTemp = pNew_local._4_4_;
    }
  }
  else {
    pNew_local._4_4_ = (pObj->field_6).iTemp;
  }
  return pNew_local._4_4_;
}

Assistant:

int Abc_NtkFlattenHierarchyGia_rec( Gia_Man_t * pNew, Vec_Ptr_t * vSupers, Abc_Obj_t * pObj, Vec_Ptr_t * vBuffers )
{
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pBox, * pFanin;  
    int iLit, i;
    if ( pObj->iTemp != -1 )
        return pObj->iTemp;
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsPo(pObj) || Abc_ObjIsBi(pObj) )
        return (pObj->iTemp = Abc_NtkFlattenHierarchyGia_rec(pNew, vSupers, Abc_ObjFanin0(pObj), vBuffers));
    if ( Abc_ObjIsPi(pObj) )
    {
        pBox   = (Abc_Obj_t *)Vec_PtrPop( vSupers );
        pModel = Abc_ObjModel(pBox);
        //printf( "   Exiting %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel) );
        pFanin = Abc_ObjFanin( pBox, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPush( vSupers, pBox );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save BI
        if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save PI
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    if ( Abc_ObjIsBo(pObj) )
    {
        pBox   = Abc_ObjFanin0(pObj);
        assert( Abc_ObjIsBox(pBox) );
        Vec_PtrPush( vSupers, pBox );
        pModel = Abc_ObjModel(pBox);
        //printf( "Entering %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel) );
        pFanin = Abc_NtkPo( pModel, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPop( vSupers );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save BO
        if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save PO
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
    return (pObj->iTemp = Abc_NodeStrashToGia( pNew, pObj ));
}